

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ai_map.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_ai_map::save(xr_scene_ai_map *this,xr_writer *w)

{
  xr_scene_revision *this_00;
  size_type value;
  xr_writer *w_local;
  xr_scene_ai_map *this_local;
  
  this_00 = xr_scene_part::revision(&this->super_xr_scene_part);
  xr_scene_revision::save(this_00,w);
  xr_writer::w_chunk<unsigned_short>(w,1,&AIMAP_VERSION);
  xr_writer::w_chunk<unsigned_int>(w,2,&this->m_flags);
  xr_writer::w_chunk<xray_re::_aabb<float>>(w,3,&this->m_bbox);
  xr_writer::open_chunk(w,4);
  xr_writer::w_float(w,this->m_cell_size);
  xr_writer::w_float(w,this->m_factor_y);
  xr_writer::w_float(w,this->m_can_up);
  xr_writer::w_float(w,this->m_can_down);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,6);
  xr_writer::w_u32(w,this->m_num_nodes);
  xr_writer::w_cseq<xray_re::ai_node_le,write_node_le>(w,this->m_num_nodes,this->m_nodes);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,8);
  xr_writer::w_float(w,this->m_visible_radius);
  xr_writer::w_u32(w,this->m_brush_size);
  xr_writer::close_chunk(w);
  xr_writer::w_chunk<float>(w,9,&this->m_smooth_height);
  xr_writer::open_chunk(w,7);
  value = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_snap_objects);
  xr_writer::w_size_u32(w,value);
  xr_writer::
  w_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_writer::f_w_sz>
            (w,&this->m_snap_objects);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_scene_ai_map::save(xr_writer& w) const
{
	revision().save(w);

	w.w_chunk(AIMAP_CHUNK_VERSION, AIMAP_VERSION);
	w.w_chunk(AIMAP_CHUNK_FLAGS, m_flags);
	w.w_chunk(AIMAP_CHUNK_BOX, m_bbox);

	w.open_chunk(AIMAP_CHUNK_PARAMS);
	w.w_float(m_cell_size);
	w.w_float(m_factor_y);
	w.w_float(m_can_up);
	w.w_float(m_can_down);
	w.close_chunk();

	w.open_chunk(AIMAP_CHUNK_NODES);
	w.w_u32(m_num_nodes);
	w.w_cseq(m_num_nodes, m_nodes, write_node_le());
	w.close_chunk();

	w.open_chunk(AIMAP_CHUNK_PREFS);
	w.w_float(m_visible_radius);
	w.w_u32(m_brush_size);
	w.close_chunk();

	w.w_chunk<float>(AIMAP_CHUNK_SMOOTH_HEIGHT, m_smooth_height);

	w.open_chunk(AIMAP_CHUNK_SNAP_OBJECTS);
	w.w_size_u32(m_snap_objects.size());
	w.w_seq(m_snap_objects, xr_writer::f_w_sz());
	w.close_chunk();
}